

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestProperty * __thiscall testing::TestResult::GetTestProperty(TestResult *this,int i)

{
  int iVar1;
  const_reference pvVar2;
  int in_ESI;
  size_type in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (-1 < in_ESI) {
    iVar1 = test_property_count((TestResult *)0x238f60);
    if (in_ESI < iVar1) {
      pvVar2 = std::vector<testing::TestProperty,_std::allocator<testing::TestProperty>_>::at
                         ((vector<testing::TestProperty,_std::allocator<testing::TestProperty>_> *)
                          CONCAT44(in_ESI,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
      return pvVar2;
    }
  }
  internal::posix::Abort();
}

Assistant:

const TestProperty& TestResult::GetTestProperty(int i) const {
  if (i < 0 || i >= test_property_count())
    internal::posix::Abort();
  return test_properties_.at(static_cast<size_t>(i));
}